

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-listen.c
# Opt level: O2

int rops_handle_POLLIN_listen(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  lws_context *plVar1;
  lws_vhost *vh;
  lws_adoption_type type;
  lws_sock_file_fd_type fd;
  int iVar2;
  lws_adoption_type lVar3;
  lws *plVar4;
  int *piVar5;
  char *pcVar6;
  socklen_t clilen;
  sockaddr_storage cli_addr;
  
  plVar1 = wsi->context;
  cli_addr.ss_family = 0;
  cli_addr.__ss_padding[0] = '\0';
  cli_addr.__ss_padding[1] = '\0';
  cli_addr.__ss_padding[2] = '\0';
  cli_addr.__ss_padding[3] = '\0';
  cli_addr.__ss_padding[4] = '\0';
  cli_addr.__ss_padding[5] = '\0';
  cli_addr.__ss_padding[6] = '\0';
  cli_addr.__ss_padding[7] = '\0';
  cli_addr.__ss_padding[8] = '\0';
  cli_addr.__ss_padding[9] = '\0';
  cli_addr.__ss_padding[10] = '\0';
  cli_addr.__ss_padding[0xb] = '\0';
  cli_addr.__ss_padding[0xc] = '\0';
  cli_addr.__ss_padding[0xd] = '\0';
  cli_addr.__ss_padding[0xe] = '\0';
  cli_addr.__ss_padding[0xf] = '\0';
  cli_addr.__ss_padding[0x10] = '\0';
  cli_addr.__ss_padding[0x11] = '\0';
  cli_addr.__ss_padding[0x12] = '\0';
  cli_addr.__ss_padding[0x13] = '\0';
  cli_addr.__ss_padding[0x14] = '\0';
  cli_addr.__ss_padding[0x15] = '\0';
  cli_addr.__ss_padding[0x16] = '\0';
  cli_addr.__ss_padding[0x17] = '\0';
  cli_addr.__ss_padding[0x18] = '\0';
  cli_addr.__ss_padding[0x19] = '\0';
  cli_addr.__ss_padding[0x1a] = '\0';
  cli_addr.__ss_padding[0x1b] = '\0';
  cli_addr.__ss_padding[0x1c] = '\0';
  cli_addr.__ss_padding[0x1d] = '\0';
  cli_addr.__ss_padding[0x1e] = '\0';
  cli_addr.__ss_padding[0x1f] = '\0';
  cli_addr.__ss_padding[0x20] = '\0';
  cli_addr.__ss_padding[0x21] = '\0';
  cli_addr.__ss_padding[0x22] = '\0';
  cli_addr.__ss_padding[0x23] = '\0';
  cli_addr.__ss_padding[0x24] = '\0';
  cli_addr.__ss_padding[0x25] = '\0';
  cli_addr.__ss_padding[0x26] = '\0';
  cli_addr.__ss_padding[0x27] = '\0';
  cli_addr.__ss_padding[0x28] = '\0';
  cli_addr.__ss_padding[0x29] = '\0';
  cli_addr.__ss_padding[0x2a] = '\0';
  cli_addr.__ss_padding[0x2b] = '\0';
  cli_addr.__ss_padding[0x2c] = '\0';
  cli_addr.__ss_padding[0x2d] = '\0';
  cli_addr.__ss_padding[0x2e] = '\0';
  cli_addr.__ss_padding[0x2f] = '\0';
  cli_addr.__ss_padding[0x30] = '\0';
  cli_addr.__ss_padding[0x31] = '\0';
  cli_addr.__ss_padding[0x32] = '\0';
  cli_addr.__ss_padding[0x33] = '\0';
  cli_addr.__ss_padding[0x34] = '\0';
  cli_addr.__ss_padding[0x35] = '\0';
  cli_addr.__ss_padding[0x36] = '\0';
  cli_addr.__ss_padding[0x37] = '\0';
  cli_addr.__ss_padding[0x38] = '\0';
  cli_addr.__ss_padding[0x39] = '\0';
  cli_addr.__ss_padding[0x3a] = '\0';
  cli_addr.__ss_padding[0x3b] = '\0';
  cli_addr.__ss_padding[0x3c] = '\0';
  cli_addr.__ss_padding[0x3d] = '\0';
  cli_addr.__ss_padding[0x3e] = '\0';
  cli_addr.__ss_padding[0x3f] = '\0';
  cli_addr.__ss_padding[0x40] = '\0';
  cli_addr.__ss_padding[0x41] = '\0';
  cli_addr.__ss_padding[0x42] = '\0';
  cli_addr.__ss_padding[0x43] = '\0';
  cli_addr.__ss_padding[0x44] = '\0';
  cli_addr.__ss_padding[0x45] = '\0';
  cli_addr.__ss_padding[0x46] = '\0';
  cli_addr.__ss_padding[0x47] = '\0';
  cli_addr.__ss_padding[0x48] = '\0';
  cli_addr.__ss_padding[0x49] = '\0';
  cli_addr.__ss_padding[0x4a] = '\0';
  cli_addr.__ss_padding[0x4b] = '\0';
  cli_addr.__ss_padding[0x4c] = '\0';
  cli_addr.__ss_padding[0x4d] = '\0';
  cli_addr.__ss_padding[0x4e] = '\0';
  cli_addr.__ss_padding[0x4f] = '\0';
  cli_addr.__ss_padding[0x50] = '\0';
  cli_addr.__ss_padding[0x51] = '\0';
  cli_addr.__ss_padding[0x52] = '\0';
  cli_addr.__ss_padding[0x53] = '\0';
  cli_addr.__ss_padding[0x54] = '\0';
  cli_addr.__ss_padding[0x55] = '\0';
  cli_addr.__ss_padding[0x56] = '\0';
  cli_addr.__ss_padding[0x57] = '\0';
  cli_addr.__ss_padding[0x58] = '\0';
  cli_addr.__ss_padding[0x59] = '\0';
  cli_addr.__ss_padding[0x5a] = '\0';
  cli_addr.__ss_padding[0x5b] = '\0';
  cli_addr.__ss_padding[0x5c] = '\0';
  cli_addr.__ss_padding[0x5d] = '\0';
  cli_addr.__ss_padding[0x5e] = '\0';
  cli_addr.__ss_padding[0x5f] = '\0';
  cli_addr.__ss_padding[0x60] = '\0';
  cli_addr.__ss_padding[0x61] = '\0';
  cli_addr.__ss_padding[0x62] = '\0';
  cli_addr.__ss_padding[99] = '\0';
  cli_addr.__ss_padding[100] = '\0';
  cli_addr.__ss_padding[0x65] = '\0';
  cli_addr.__ss_padding[0x66] = '\0';
  cli_addr.__ss_padding[0x67] = '\0';
  cli_addr.__ss_padding[0x68] = '\0';
  cli_addr.__ss_padding[0x69] = '\0';
  cli_addr.__ss_padding[0x6a] = '\0';
  cli_addr.__ss_padding[0x6b] = '\0';
  cli_addr.__ss_padding[0x6c] = '\0';
  cli_addr.__ss_padding[0x6d] = '\0';
  cli_addr.__ss_padding[0x6e] = '\0';
  cli_addr.__ss_padding[0x6f] = '\0';
  cli_addr.__ss_padding[0x70] = '\0';
  cli_addr.__ss_padding[0x71] = '\0';
  cli_addr.__ss_padding[0x72] = '\0';
  cli_addr.__ss_padding[0x73] = '\0';
  cli_addr.__ss_padding[0x74] = '\0';
  cli_addr.__ss_padding[0x75] = '\0';
  cli_addr.__ss_align = 0;
  iVar2 = 5;
  if ((wsi->vhost->field_0x2b4 & 4) == 0) {
    while( true ) {
      if ((pollfd->revents & 5) == 0) {
        return 5;
      }
      if ((pollfd->events & 1) == 0) {
        return 5;
      }
      if ((((wsi->vhost->tls).use_ssl != 0) && (plVar1->simultaneous_ssl_restriction != 0)) &&
         (plVar1->simultaneous_ssl == plVar1->simultaneous_ssl_restriction)) {
        return 5;
      }
      clilen = 0x80;
      fd.sockfd = accept(pollfd->fd,(sockaddr *)&cli_addr,&clilen);
      if (fd.sockfd == -1) {
        piVar5 = __errno_location();
        if (*piVar5 == 0xb) {
          return 5;
        }
        pcVar6 = strerror(*piVar5);
        _lws_log(1,"accept: %s\n",pcVar6);
        return 5;
      }
      if ((plVar1->field_0x510 & 4) != 0) break;
      lws_plat_set_socket_options(wsi->vhost,fd.sockfd,0);
      _lws_log(0x10,"accepted new conn port %u on fd=%d\n",
               (ulong)(ushort)(cli_addr.__ss_padding._0_2_ << 8 |
                              (ushort)cli_addr.__ss_padding._0_2_ >> 8),(ulong)(uint)fd.sockfd);
      iVar2 = (*wsi->vhost->protocols->callback)
                        (wsi,LWS_CALLBACK_FILTER_NETWORK_CONNECTION,(void *)0x0,
                         (void *)(long)fd.sockfd,0);
      if (iVar2 != 0) {
        _lws_log(0x10,"Callback denied net connection\n");
        break;
      }
      vh = wsi->vhost;
      lVar3 = (LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP) -
              (((uint)vh->options >> 0x16 & 1) != 0);
      type = lVar3 & (LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP);
      if ((vh->tls).use_ssl != 0) {
        type = lVar3;
      }
      plVar4 = lws_adopt_descriptor_vhost(vh,type,fd,(char *)0x0,(lws *)0x0);
      if (plVar4 == (lws *)0x0) {
        _lws_log(8,"%s: vh %s: adopt failed\n","rops_handle_POLLIN_listen",wsi->vhost->name);
        return 4;
      }
      if (plVar1->fd_limit_per_thread - 1 <= pt->fds_count) {
        return 5;
      }
      if ((long)wsi->position_in_fds_table == -1) {
        return 5;
      }
      iVar2 = lws_poll_listen_fd(pt->fds + wsi->position_in_fds_table);
      if (iVar2 < 1) {
        return 5;
      }
    }
    close(fd.sockfd);
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

static int
rops_handle_POLLIN_listen(struct lws_context_per_thread *pt, struct lws *wsi,
			  struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->context;
	lws_sockfd_type accept_fd = LWS_SOCK_INVALID;
	lws_sock_file_fd_type fd;
	struct sockaddr_storage cli_addr;
	socklen_t clilen;

	memset(&cli_addr, 0, sizeof(cli_addr));

	/* if our vhost is going down, ignore it */

	if (wsi->vhost->being_destroyed)
		return LWS_HPI_RET_HANDLED;

	/* pollin means a client has connected to us then
	 *
	 * pollout is a hack on esp32 for background accepts signalling
	 * they completed
	 */

	do {
		struct lws *cwsi;
		int opts = LWS_ADOPT_SOCKET | LWS_ADOPT_ALLOW_SSL;

		if (!(pollfd->revents & (LWS_POLLIN | LWS_POLLOUT)) ||
		    !(pollfd->events & LWS_POLLIN))
			break;

#if defined(LWS_WITH_TLS)
		/*
		 * can we really accept it, with regards to SSL limit?
		 * another vhost may also have had POLLIN on his
		 * listener this round and used it up already
		 */
		if (wsi->vhost->tls.use_ssl &&
		    context->simultaneous_ssl_restriction &&
		    context->simultaneous_ssl ==
				  context->simultaneous_ssl_restriction)
			/*
			 * no... ignore it, he won't come again until
			 * we are below the simultaneous_ssl_restriction
			 * limit and POLLIN is enabled on him again
			 */
			break;
#endif
		/* listen socket got an unencrypted connection... */

		clilen = sizeof(cli_addr);

		/*
		 * We cannot identify the peer who is in the listen
		 * socket connect queue before we accept it; even if
		 * we could, not accepting it due to PEER_LIMITS would
		 * block the connect queue for other legit peers.
		 */

		accept_fd = accept((int)pollfd->fd,
				   (struct sockaddr *)&cli_addr, &clilen);
		if (accept_fd == LWS_SOCK_INVALID) {
			if (LWS_ERRNO == LWS_EAGAIN ||
			    LWS_ERRNO == LWS_EWOULDBLOCK) {
				break;
			}
			lwsl_err("accept: %s\n", strerror(LWS_ERRNO));
			return LWS_HPI_RET_HANDLED;
		}

		if (context->being_destroyed) {
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		lws_plat_set_socket_options(wsi->vhost, accept_fd, 0);

#if defined(LWS_WITH_IPV6)
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			((cli_addr.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &cli_addr)->sin6_port) :
			ntohs(((struct sockaddr_in *) &cli_addr)->sin_port)),
			accept_fd);
#else
		{
		struct sockaddr_in sain;

		memcpy(&sain, &cli_addr, sizeof(sain));
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			   ntohs(sain.sin_port),
			   accept_fd);
		}
#endif

		/*
		 * look at who we connected to and give user code a
		 * chance to reject based on client IP.  There's no
		 * protocol selected yet so we issue this to
		 * protocols[0]
		 */
		if ((wsi->vhost->protocols[0].callback)(wsi,
				LWS_CALLBACK_FILTER_NETWORK_CONNECTION,
				NULL,
				(void *)(lws_intptr_t)accept_fd, 0)) {
			lwsl_debug("Callback denied net connection\n");
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		if (!(wsi->vhost->options &
			LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG))
			opts |= LWS_ADOPT_HTTP;

#if defined(LWS_WITH_TLS)
		if (!wsi->vhost->tls.use_ssl)
#endif
			opts &= ~LWS_ADOPT_ALLOW_SSL;

		fd.sockfd = accept_fd;
		cwsi = lws_adopt_descriptor_vhost(wsi->vhost, opts, fd,
						  NULL, NULL);
		if (!cwsi) {
			lwsl_info("%s: vh %s: adopt failed\n", __func__,
					wsi->vhost->name);

			/* already closed cleanly as necessary */
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}
/*
		if (lws_server_socket_service_ssl(cwsi, accept_fd)) {
			lws_close_free_wsi(cwsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "listen svc fail");
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}

		lwsl_info("%s: new wsi %p: wsistate 0x%lx, role_ops %s\n",
			    __func__, cwsi, (unsigned long)cwsi->wsistate,
			    cwsi->role_ops->name);
*/

	} while (pt->fds_count < context->fd_limit_per_thread - 1 &&
		 wsi->position_in_fds_table != LWS_NO_FDS_POS &&
		 lws_poll_listen_fd(&pt->fds[wsi->position_in_fds_table]) > 0);

	return LWS_HPI_RET_HANDLED;
}